

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simdjson.h
# Opt level: O0

uint32_t simdjson::fallback::anon_unknown_0::jsoncharutils::hex_to_u32_nocheck(uint8_t *src)

{
  uint32_t v4;
  uint32_t v3;
  uint32_t v2;
  uint32_t v1;
  uint8_t *src_local;
  
  return *(uint *)(internal::digit_to_val32 + (long)(int)(*src + 0x276) * 4) |
         *(uint *)(internal::digit_to_val32 + (long)(int)(src[1] + 0x1a4) * 4) |
         *(uint *)(internal::digit_to_val32 + (long)(int)(src[2] + 0xd2) * 4) |
         *(uint *)(internal::digit_to_val32 + (long)(int)(uint)src[3] * 4);
}

Assistant:

static inline uint32_t hex_to_u32_nocheck(
    const uint8_t *src) { // strictly speaking, static inline is a C-ism
  uint32_t v1 = internal::digit_to_val32[630 + src[0]];
  uint32_t v2 = internal::digit_to_val32[420 + src[1]];
  uint32_t v3 = internal::digit_to_val32[210 + src[2]];
  uint32_t v4 = internal::digit_to_val32[0 + src[3]];
  return v1 | v2 | v3 | v4;
}